

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

ostringstream * __thiscall juzzlin::SimpleLogger::error_abi_cxx11_(SimpleLogger *this)

{
  _Head_base<0UL,_juzzlin::SimpleLogger::Impl_*,_false> this_00;
  
  this_00._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<juzzlin::SimpleLogger::Impl,_std::default_delete<juzzlin::SimpleLogger::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_juzzlin::SimpleLogger::Impl_*,_std::default_delete<juzzlin::SimpleLogger::Impl>_>
       .super__Head_base<0UL,_juzzlin::SimpleLogger::Impl_*,_false>._M_head_impl;
  (this_00._M_head_impl)->m_activeLevel = 4;
  Impl::prefixWithTimestamp(this_00._M_head_impl);
  Impl::prefixWithLevelAndTag(this_00._M_head_impl,Error);
  return &(this_00._M_head_impl)->m_message;
}

Assistant:

void SimpleLogger::Impl::enableEchoMode(bool enable)
{
    m_echoMode = enable;
}